

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

int Spl_ManComputeOne(Spl_Man_t *p,int iPivot)

{
  uint *puVar1;
  Gia_Man_t *p_00;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  Vec_Bit_t *pVVar9;
  long lVar10;
  
  if (-1 < iPivot) {
    p_00 = p->pGia;
    pVVar2 = p_00->vMapping2;
    if (iPivot < pVVar2->nSize) {
      if (pVVar2->pArray[(uint)iPivot].nSize == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iPivot)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                      ,0x1d0,"int Spl_ManComputeOne(Spl_Man_t *, int)");
      }
      pVVar3 = p->vNodes;
      if (0 < pVVar3->nSize) {
        piVar4 = pVVar3->pArray;
        pVVar9 = p->vMarksNo;
        lVar10 = 0;
        do {
          uVar7 = piVar4[lVar10];
          if (((int)uVar7 < 0) || (pVVar9->nSize <= (int)uVar7)) goto LAB_007ddcdf;
          bVar6 = (byte)uVar7 & 0x1f;
          puVar1 = (uint *)(pVVar9->pArray + (uVar7 >> 5));
          *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar3->nSize);
      }
      pVVar5 = p->vAnds;
      if (pVVar5->nSize < 1) {
        pVVar9 = p->vMarksAnd;
      }
      else {
        piVar4 = pVVar5->pArray;
        pVVar9 = p->vMarksAnd;
        lVar10 = 0;
        do {
          uVar7 = piVar4[lVar10];
          if (((int)uVar7 < 0) || (pVVar9->nSize <= (int)uVar7)) {
LAB_007ddcdf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          bVar6 = (byte)uVar7 & 0x1f;
          pVVar9->pArray[uVar7 >> 5] =
               pVVar9->pArray[uVar7 >> 5] & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar5->nSize);
      }
      iVar8 = 0;
      pVVar3->nSize = 0;
      pVVar5->nSize = 0;
      Spl_ManLutMffcSize(p_00,iPivot,p->vCands,pVVar9);
      Spl_ManAddNode(p,iPivot,p->vCands);
      if (p->vAnds->nSize <= p->Limit) {
        uVar7 = Spl_ManFindOne(p);
        while (uVar7 != 0) {
          if ((int)uVar7 < 0) goto LAB_007ddcfe;
          pVVar2 = p->pGia->vMapping2;
          if (pVVar2->nSize <= (int)uVar7) goto LAB_007ddcfe;
          if (pVVar2->pArray[uVar7].nSize == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                          ,0x1e8,"int Spl_ManComputeOne(Spl_Man_t *, int)");
          }
          if (p->vMarksNo->nSize <= (int)uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          if (((uint)p->vMarksNo->pArray[uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) {
            __assert_fail("!Vec_BitEntry(p->vMarksNo, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                          ,0x1e9,"int Spl_ManComputeOne(Spl_Man_t *, int)");
          }
          iVar8 = Spl_ManLutMffcSize(p->pGia,uVar7,p->vCands,p->vMarksAnd);
          if (p->Limit < iVar8 + p->vAnds->nSize) break;
          Spl_ManAddNode(p,uVar7,p->vCands);
          uVar7 = Spl_ManFindOne(p);
        }
        qsort(p->vNodes->pArray,(long)p->vNodes->nSize,4,Vec_IntSortCompare1);
        qsort(p->vAnds->pArray,(long)p->vAnds->nSize,4,Vec_IntSortCompare1);
        Spl_ManWinFindLeavesRoots(p);
        qsort(p->vLeaves->pArray,(long)p->vLeaves->nSize,4,Vec_IntSortCompare1);
        qsort(p->vRoots->pArray,(long)p->vRoots->nSize,4,Vec_IntSortCompare1);
        iVar8 = 1;
      }
      return iVar8;
    }
  }
LAB_007ddcfe:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Spl_ManComputeOne( Spl_Man_t * p, int iPivot )
{
    int CountAdd, iObj, i;
    assert( Gia_ObjIsLut2(p->pGia, iPivot) );
//Gia_ManPrintCone2( p->pGia, Gia_ManObj(p->pGia, iPivot) );
    // assume it was previously filled in
    Vec_IntForEachEntry( p->vNodes, iObj, i )
        Vec_BitWriteEntry( p->vMarksNo, iObj, 0 );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        Vec_BitWriteEntry( p->vMarksAnd, iObj, 0 );
    // double check that it is empty
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksNo, iObj) );
    //Gia_ManForEachLut2( p->pGia, iObj )
    //    assert( !Vec_BitEntry(p->vMarksAnd, iObj) );
    // clean arrays
    Vec_IntClear( p->vNodes );
    Vec_IntClear( p->vAnds );
    // add root node
    Spl_ManLutMffcSize( p->pGia, iPivot, p->vCands, p->vMarksAnd );
    Spl_ManAddNode( p, iPivot, p->vCands );
    if ( Vec_IntSize(p->vAnds) > p->Limit )
        return 0;
    //printf( "%d ", iPivot );
    // add one node at a time
    while ( (iObj = Spl_ManFindOne(p)) )
    {
        assert( Gia_ObjIsLut2(p->pGia, iObj) );
        assert( !Vec_BitEntry(p->vMarksNo, iObj) );
        CountAdd = Spl_ManLutMffcSize( p->pGia, iObj, p->vCands, p->vMarksAnd );
        if ( Vec_IntSize(p->vAnds) + CountAdd > p->Limit )
            break;
        Spl_ManAddNode( p, iObj, p->vCands );
        //printf( "+%d ", iObj );
    }
    //printf( "\n" );
    Vec_IntSort( p->vNodes, 0 );
    Vec_IntSort( p->vAnds, 0 );
    Spl_ManWinFindLeavesRoots( p );
    Vec_IntSort( p->vLeaves, 0 );
    Vec_IntSort( p->vRoots, 0 );
    return 1;
}